

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program.cpp
# Opt level: O1

bool __thiscall Clasp::Asp::LogicProgram::propagate(LogicProgram *this,bool backprop)

{
  uint uVar1;
  PrgNode PVar2;
  bool bVar3;
  bool bVar4;
  PrgAtom *pPVar5;
  byte bVar6;
  Literal x;
  uint uVar7;
  ulong uVar8;
  bool bVar9;
  
  uVar1 = *(uint *)&(this->opts_).field_0x4;
  *(uint *)&(this->opts_).field_0x4 = uVar1 & 0xdfffffff | (uint)backprop << 0x1d;
  bVar9 = (this->propQ_).ebo_.size == 0;
  if (!bVar9) {
    uVar8 = 0;
    do {
      pPVar5 = (this->atoms_).ebo_.buf[(this->propQ_).ebo_.buf[uVar8]];
      bVar3 = false;
      if (((pPVar5->super_PrgHead).super_PrgNode.field_0x7 & 0x40) == 0) {
        bVar3 = PrgAtom::propagateValue(pPVar5,this,backprop);
        if (bVar3) {
          PVar2 = (pPVar5->super_PrgHead).super_PrgNode;
          bVar3 = false;
          if (((PVar2._0_4_ & 0x7fffffff) != 1) && ((PVar2._4_4_ & 0xfffffff) < (this->input_).lo))
          {
            bVar6 = PVar2._7_1_ >> 4 & 3;
            x.rep_ = ((uint)(bVar6 == 2) ^ PVar2._0_4_) * 2;
            bVar3 = false;
            if (bVar6 == 0) {
              x.rep_ = 0;
            }
            bVar4 = SharedContext::addUnary((this->super_ProgramBuilder).ctx_,x);
            if (!bVar4) goto LAB_00140a8b;
          }
        }
        else {
LAB_00140a8b:
          pPVar5 = getTrueAtom(this);
          (pPVar5->super_PrgHead).super_PrgNode =
               (PrgNode)(((ulong)(pPVar5->super_PrgHead).super_PrgNode & 0xffffffff80000000) + 1);
          bVar3 = true;
        }
      }
      if (bVar3) {
        return bVar9;
      }
      uVar7 = (int)uVar8 + 1;
      uVar8 = (ulong)uVar7;
      bVar9 = uVar7 == (this->propQ_).ebo_.size;
    } while (!bVar9);
  }
  *(uint *)&(this->opts_).field_0x4 =
       *(uint *)&(this->opts_).field_0x4 & 0xdfffffff | uVar1 & 0x20000000;
  (this->propQ_).ebo_.size = 0;
  return bVar9;
}

Assistant:

bool LogicProgram::propagate(bool backprop) {
	assert(frozen());
	bool oldB = opts_.backprop != 0;
	opts_.backprop = backprop;
	for (VarVec::size_type i = 0; i != propQ_.size(); ++i) {
		PrgAtom* a = getAtom(propQ_[i]);
		if (!a->relevant()) { continue; }
		if (!a->propagateValue(*this, backprop)) {
			setConflict();
			return false;
		}
		if (a->hasVar() && a->id() < startAtom() && !ctx()->addUnary(a->trueLit())) {
			setConflict();
			return false;
		}
	}
	opts_.backprop = oldB;
	propQ_.clear();
	return true;
}